

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixUtils.cpp
# Opt level: O1

set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
* getEigenSpaceBasis(set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                     *__return_storage_ptr__,RationalNum **matrix,uint size,RationalNum eigenValue)

{
  void *pvVar1;
  bool bVar2;
  ulong __n;
  RationalNum **matrix_00;
  RationalNum *pRVar3;
  RationalNum **ppRVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  int i;
  _Rb_tree_color _Var8;
  _Rb_tree_header *p_Var9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
  *basis;
  vector<RationalNum,_std::allocator<RationalNum>_> basisVector;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> basisFields;
  ulong local_e0;
  vector<RationalNum,_std::allocator<RationalNum>_> local_d0;
  ulong local_b8;
  RationalNum **local_b0;
  long local_a8;
  long local_a0;
  RationalNum local_98;
  ulong local_88;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_80;
  RationalNum local_50;
  RationalNum local_40;
  
  local_40.denominator = eigenValue.denominator;
  local_40.numerator = eigenValue.numerator;
  __n = (ulong)size;
  matrix_00 = (RationalNum **)operator_new__(__n * 8);
  if (size != 0) {
    uVar11 = __n << 4;
    uVar15 = 0;
    do {
      pRVar3 = (RationalNum *)operator_new__(uVar11);
      uVar17 = 0;
      do {
        RationalNum::RationalNum((RationalNum *)((long)&pRVar3->numerator + uVar17));
        uVar17 = uVar17 + 0x10;
      } while (uVar11 != uVar17);
      matrix_00[uVar15] = pRVar3;
      uVar17 = 0;
      do {
        RationalNum::operator=
                  ((RationalNum *)((long)&matrix_00[uVar15]->numerator + uVar17),
                   (RationalNum *)((long)&matrix[uVar15]->numerator + uVar17));
        uVar17 = uVar17 + 0x10;
      } while (uVar11 != uVar17);
      uVar15 = uVar15 + 1;
    } while (uVar15 != __n);
    lVar18 = 0;
    ppRVar4 = matrix_00;
    do {
      RationalNum::operator-=((RationalNum *)((long)&(*ppRVar4)->numerator + lVar18),&local_40);
      lVar18 = lVar18 + 0x10;
      ppRVar4 = ppRVar4 + 1;
    } while (__n << 4 != lVar18);
  }
  ppRVar4 = getGaussForm(matrix_00,size);
  p_Var9 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var9->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var9->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if (size != 0) {
    local_a0 = __n << 4;
    local_e0 = 0;
    local_b0 = matrix_00;
    do {
      lVar18 = 0;
      iVar10 = 0;
      do {
        pRVar3 = ppRVar4[local_e0];
        RationalNum::RationalNum((RationalNum *)&local_d0,0,1);
        bVar2 = operator!=((RationalNum *)((long)&pRVar3->numerator + lVar18),
                           (RationalNum *)&local_d0);
        if (bVar2) {
          local_d0.super__Vector_base<RationalNum,_std::allocator<RationalNum>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = iVar10;
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_insert_unique<unsigned_int>(&local_80,(uint *)&local_d0);
          break;
        }
        iVar10 = iVar10 + 1;
        lVar18 = lVar18 + 0x10;
      } while (local_a0 != lVar18);
      local_e0 = local_e0 + 1;
    } while (local_e0 != __n);
    uVar11 = 0;
    matrix_00 = local_b0;
    do {
      p_Var9 = &local_80._M_impl.super__Rb_tree_header;
      uVar14 = (uint)uVar11;
      p_Var5 = &p_Var9->_M_header;
      for (p_Var6 = local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0; p_Var6 = (&p_Var6->_M_left)[bVar2]) {
        bVar2 = (uint)*(size_t *)(p_Var6 + 1) < uVar14;
        if (!bVar2) {
          p_Var5 = p_Var6;
        }
      }
      p_Var7 = p_Var9;
      if (((_Rb_tree_header *)p_Var5 != p_Var9) &&
         (p_Var7 = (_Rb_tree_header *)p_Var5,
         uVar14 < (uint)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
        p_Var7 = p_Var9;
      }
      if (p_Var7 == p_Var9) {
        std::vector<RationalNum,_std::allocator<RationalNum>_>::vector
                  (&local_d0,__n,(allocator_type *)&local_98);
        RationalNum::RationalNum(&local_98,1,1);
        RationalNum::operator=
                  ((RationalNum *)
                   (uVar11 * 0x10 +
                   CONCAT44(local_d0.super__Vector_base<RationalNum,_std::allocator<RationalNum>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)local_d0.
                                 super__Vector_base<RationalNum,_std::allocator<RationalNum>_>.
                                 _M_impl.super__Vector_impl_data._M_start)),&local_98);
        uVar15 = 0;
        local_88 = uVar11;
        do {
          lVar18 = 0;
          uVar12 = 0;
          local_b8 = uVar15;
          do {
            pRVar3 = ppRVar4[~(uint)uVar15 + size];
            RationalNum::RationalNum(&local_98,0,1);
            bVar2 = operator!=((RationalNum *)((long)&pRVar3->numerator + lVar18),&local_98);
            uVar13 = uVar12;
            if (bVar2) break;
            uVar12 = uVar12 + 1;
            lVar18 = lVar18 + 0x10;
            uVar13 = size;
          } while (local_a0 != lVar18);
          if (uVar13 != size) {
            local_a8 = (long)(int)uVar13;
            if (uVar13 + 1 < size) {
              uVar12 = (uint)local_b8;
              lVar18 = (long)(int)(uVar13 + 1);
              lVar16 = local_a8 * 0x10;
              do {
                p_Var6 = &local_80._M_impl.super__Rb_tree_header._M_header;
                for (p_Var5 = local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
                    _Var8 = (_Rb_tree_color)lVar18, p_Var5 != (_Base_ptr)0x0;
                    p_Var5 = (&p_Var5->_M_left)[bVar2]) {
                  bVar2 = p_Var5[1]._M_color < _Var8;
                  if (!bVar2) {
                    p_Var6 = p_Var5;
                  }
                }
                p_Var9 = &local_80._M_impl.super__Rb_tree_header;
                p_Var5 = &p_Var9->_M_header;
                if (((_Rb_tree_header *)p_Var6 != p_Var9) &&
                   (p_Var5 = p_Var6, _Var8 < p_Var6[1]._M_color)) {
                  p_Var5 = &p_Var9->_M_header;
                }
                if ((lVar18 == (int)uVar14) ||
                   ((_Rb_tree_header *)p_Var5 != &local_80._M_impl.super__Rb_tree_header)) {
                  local_98 = operator*((RationalNum *)
                                       (CONCAT44(local_d0.
                                                 super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 (int)local_d0.
                                                  super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                       lVar18 * 0x10),ppRVar4[~uVar12 + size] + lVar18);
                  RationalNum::operator+=
                            ((RationalNum *)
                             (CONCAT44(local_d0.
                                       super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_d0.
                                            super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                            ._M_impl.super__Vector_impl_data._M_start) + lVar16),
                             &local_98);
                }
                lVar18 = lVar18 + 1;
              } while ((uint)lVar18 < size);
            }
            lVar18 = local_a8;
            lVar16 = local_a8 * 0x10;
            local_50 = RationalNum::operator-
                                 ((RationalNum *)
                                  (CONCAT44(local_d0.
                                            super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                            (int)local_d0.
                                                 super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) + lVar16
                                  ));
            local_98 = operator/(&local_50,ppRVar4[~(uint)local_b8 + size] + lVar18);
            RationalNum::operator=
                      ((RationalNum *)
                       (lVar16 + CONCAT44(local_d0.
                                          super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)local_d0.
                                               super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                               ._M_impl.super__Vector_impl_data._M_start)),&local_98
                      );
          }
          uVar15 = local_b8 + 1;
        } while (uVar15 != __n);
        std::
        _Rb_tree<std::vector<RationalNum,std::allocator<RationalNum>>,std::vector<RationalNum,std::allocator<RationalNum>>,std::_Identity<std::vector<RationalNum,std::allocator<RationalNum>>>,std::less<std::vector<RationalNum,std::allocator<RationalNum>>>,std::allocator<std::vector<RationalNum,std::allocator<RationalNum>>>>
        ::_M_insert_unique<std::vector<RationalNum,std::allocator<RationalNum>>const&>
                  ((_Rb_tree<std::vector<RationalNum,std::allocator<RationalNum>>,std::vector<RationalNum,std::allocator<RationalNum>>,std::_Identity<std::vector<RationalNum,std::allocator<RationalNum>>>,std::less<std::vector<RationalNum,std::allocator<RationalNum>>>,std::allocator<std::vector<RationalNum,std::allocator<RationalNum>>>>
                    *)__return_storage_ptr__,&local_d0);
        uVar11 = local_88;
        matrix_00 = local_b0;
        pvVar1 = (void *)CONCAT44(local_d0.
                                  super__Vector_base<RationalNum,_std::allocator<RationalNum>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_d0.
                                       super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,(long)local_d0.
                                       super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar1);
        }
      }
      uVar14 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar14;
    } while (uVar14 != size);
    uVar11 = 0;
    do {
      if (ppRVar4[uVar11] != (RationalNum *)0x0) {
        operator_delete__(ppRVar4[uVar11]);
      }
      if (matrix_00[uVar11] != (RationalNum *)0x0) {
        operator_delete__(matrix_00[uVar11]);
      }
      uVar11 = uVar11 + 1;
    } while (__n != uVar11);
  }
  operator_delete__(ppRVar4);
  operator_delete__(matrix_00);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_80);
  return __return_storage_ptr__;
}

Assistant:

set<vector<RationalNum>> getEigenSpaceBasis(RationalNum** matrix, unsigned int size, RationalNum eigenValue) {
    RationalNum** editedMatrix = new RationalNum* [size];
    for(int i = 0; i < size; i++) {
        editedMatrix[i] = new RationalNum [size];
        for(int j = 0; j < size; j++) editedMatrix[i][j] = matrix[i][j];
    }
    for(int i = 0; i < size; i++) editedMatrix[i][i] -= eigenValue;

    RationalNum** gaussForm = getGaussForm(editedMatrix, size);
    set<vector<RationalNum>> basis;

    set<unsigned int> basisFields;
    for(int i = 0; i < size; i++) {
        for(int j = 0; j < size; j++) {
            if(gaussForm[i][j] != 0ll) {
                basisFields.insert(j);
                break;
            }
        }
    }
    for(unsigned int k = 0; k < size; k++) {
        if(basisFields.find(k) != basisFields.end()) continue;
        vector<RationalNum> basisVector(size);
        basisVector[k] = 1ll;
        for(int i = 0; i < size; i++) {
            int cur = size;
            for(int j = 0; j < size; j++) {
                if(gaussForm[size - i - 1][j] != 0ll) {
                    cur = j;
                    break;
                }
            }
            if(cur == size) continue;
            for(int j = cur + 1; j < size; j++) {
                if(basisFields.find(j) != basisFields.end() || j == k) basisVector[cur] += basisVector[j] * gaussForm[size - i - 1][j];
            }
            basisVector[cur] = -basisVector[cur] / gaussForm[size - i - 1][cur];
        }
        basis.insert(basisVector);
    }

    for(int i = 0; i < size; i++) {
        delete[] gaussForm[i];
        delete[] editedMatrix[i];
    }
    delete[] gaussForm;
    delete[] editedMatrix;

    return basis;
}